

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O1

void proto3_unittest::TestHasbits::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  MessageLite *from_msg_00;
  ulong uVar2;
  intptr_t iVar3;
  _func_int **pp_Var4;
  Nonnull<const_char_*> pcVar5;
  Arena *arena;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar5 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar5 == (Nonnull<const_char_*>)0x0) {
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((char)uVar1 != '\0') {
      if (((uVar1 & 1) != 0) && (*(char *)&from_msg[2]._vptr_MessageLite == '\x01')) {
        *(undefined1 *)&to_msg[2]._vptr_MessageLite = 1;
      }
      if (((uVar1 & 2) != 0) && (*(char *)((long)&from_msg[2]._vptr_MessageLite + 1) == '\x01')) {
        *(undefined1 *)((long)&to_msg[2]._vptr_MessageLite + 1) = 1;
      }
      if (((uVar1 & 4) != 0) && (*(char *)((long)&from_msg[2]._vptr_MessageLite + 2) == '\x01')) {
        *(undefined1 *)((long)&to_msg[2]._vptr_MessageLite + 2) = 1;
      }
      if (((uVar1 & 8) != 0) && (*(char *)((long)&from_msg[2]._vptr_MessageLite + 3) == '\x01')) {
        *(undefined1 *)((long)&to_msg[2]._vptr_MessageLite + 3) = 1;
      }
      if (((uVar1 & 0x10) != 0) && (*(char *)((long)&from_msg[2]._vptr_MessageLite + 4) == '\x01'))
      {
        *(undefined1 *)((long)&to_msg[2]._vptr_MessageLite + 4) = 1;
      }
      if (((uVar1 & 0x20) != 0) && (*(char *)((long)&from_msg[2]._vptr_MessageLite + 5) == '\x01'))
      {
        *(undefined1 *)((long)&to_msg[2]._vptr_MessageLite + 5) = 1;
      }
      if (((uVar1 & 0x40) != 0) && (*(char *)((long)&from_msg[2]._vptr_MessageLite + 6) == '\x01'))
      {
        *(undefined1 *)((long)&to_msg[2]._vptr_MessageLite + 6) = 1;
      }
      if (((char)uVar1 < '\0') && (*(char *)((long)&from_msg[2]._vptr_MessageLite + 7) == '\x01')) {
        *(undefined1 *)((long)&to_msg[2]._vptr_MessageLite + 7) = 1;
      }
    }
    if ((uVar1 & 0xff00) != 0) {
      if (((uVar1 >> 8 & 1) != 0) && ((char)from_msg[2]._internal_metadata_.ptr_ == '\x01')) {
        *(undefined1 *)&to_msg[2]._internal_metadata_.ptr_ = 1;
      }
      if (((uVar1 >> 9 & 1) != 0) &&
         (*(char *)((long)&from_msg[2]._internal_metadata_.ptr_ + 1) == '\x01')) {
        *(undefined1 *)((long)&to_msg[2]._internal_metadata_.ptr_ + 1) = 1;
      }
      if (((uVar1 >> 10 & 1) != 0) &&
         (*(char *)((long)&from_msg[2]._internal_metadata_.ptr_ + 2) == '\x01')) {
        *(undefined1 *)((long)&to_msg[2]._internal_metadata_.ptr_ + 2) = 1;
      }
      if (((uVar1 >> 0xb & 1) != 0) &&
         (*(char *)((long)&from_msg[2]._internal_metadata_.ptr_ + 3) == '\x01')) {
        *(undefined1 *)((long)&to_msg[2]._internal_metadata_.ptr_ + 3) = 1;
      }
      if (((uVar1 >> 0xc & 1) != 0) &&
         (*(char *)((long)&from_msg[2]._internal_metadata_.ptr_ + 4) == '\x01')) {
        *(undefined1 *)((long)&to_msg[2]._internal_metadata_.ptr_ + 4) = 1;
      }
      if (((uVar1 >> 0xd & 1) != 0) &&
         (*(char *)((long)&from_msg[2]._internal_metadata_.ptr_ + 5) == '\x01')) {
        *(undefined1 *)((long)&to_msg[2]._internal_metadata_.ptr_ + 5) = 1;
      }
      if (((uVar1 >> 0xe & 1) != 0) &&
         (*(char *)((long)&from_msg[2]._internal_metadata_.ptr_ + 6) == '\x01')) {
        *(undefined1 *)((long)&to_msg[2]._internal_metadata_.ptr_ + 6) = 1;
      }
      if (((short)uVar1 < 0) &&
         (*(char *)((long)&from_msg[2]._internal_metadata_.ptr_ + 7) == '\x01')) {
        *(undefined1 *)((long)&to_msg[2]._internal_metadata_.ptr_ + 7) = 1;
      }
    }
    if ((uVar1 & 0xff0000) != 0) {
      if (((uVar1 >> 0x10 & 1) != 0) && (*(char *)&from_msg[3]._vptr_MessageLite == '\x01')) {
        *(undefined1 *)&to_msg[3]._vptr_MessageLite = 1;
      }
      if (((uVar1 >> 0x11 & 1) != 0) &&
         (*(char *)((long)&from_msg[3]._vptr_MessageLite + 1) == '\x01')) {
        *(undefined1 *)((long)&to_msg[3]._vptr_MessageLite + 1) = 1;
      }
      if (((uVar1 >> 0x12 & 1) != 0) &&
         (*(char *)((long)&from_msg[3]._vptr_MessageLite + 2) == '\x01')) {
        *(undefined1 *)((long)&to_msg[3]._vptr_MessageLite + 2) = 1;
      }
      if (((uVar1 >> 0x13 & 1) != 0) &&
         (*(char *)((long)&from_msg[3]._vptr_MessageLite + 3) == '\x01')) {
        *(undefined1 *)((long)&to_msg[3]._vptr_MessageLite + 3) = 1;
      }
      if (((uVar1 >> 0x14 & 1) != 0) &&
         (*(char *)((long)&from_msg[3]._vptr_MessageLite + 4) == '\x01')) {
        *(undefined1 *)((long)&to_msg[3]._vptr_MessageLite + 4) = 1;
      }
      if (((uVar1 >> 0x15 & 1) != 0) &&
         (*(char *)((long)&from_msg[3]._vptr_MessageLite + 5) == '\x01')) {
        *(undefined1 *)((long)&to_msg[3]._vptr_MessageLite + 5) = 1;
      }
      if (((uVar1 >> 0x16 & 1) != 0) &&
         (*(char *)((long)&from_msg[3]._vptr_MessageLite + 6) == '\x01')) {
        *(undefined1 *)((long)&to_msg[3]._vptr_MessageLite + 6) = 1;
      }
      if (((uVar1 >> 0x17 & 1) != 0) &&
         (*(char *)((long)&from_msg[3]._vptr_MessageLite + 7) == '\x01')) {
        *(undefined1 *)((long)&to_msg[3]._vptr_MessageLite + 7) = 1;
      }
    }
    if (0xffffff < uVar1) {
      if (((uVar1 >> 0x18 & 1) != 0) && ((char)from_msg[3]._internal_metadata_.ptr_ == '\x01')) {
        *(undefined1 *)&to_msg[3]._internal_metadata_.ptr_ = 1;
      }
      if (((uVar1 >> 0x19 & 1) != 0) &&
         (*(char *)((long)&from_msg[3]._internal_metadata_.ptr_ + 1) == '\x01')) {
        *(undefined1 *)((long)&to_msg[3]._internal_metadata_.ptr_ + 1) = 1;
      }
      if (((uVar1 >> 0x1a & 1) != 0) &&
         (*(char *)((long)&from_msg[3]._internal_metadata_.ptr_ + 2) == '\x01')) {
        *(undefined1 *)((long)&to_msg[3]._internal_metadata_.ptr_ + 2) = 1;
      }
      if (((uVar1 >> 0x1b & 1) != 0) &&
         (*(char *)((long)&from_msg[3]._internal_metadata_.ptr_ + 3) == '\x01')) {
        *(undefined1 *)((long)&to_msg[3]._internal_metadata_.ptr_ + 3) = 1;
      }
      if (((uVar1 >> 0x1c & 1) != 0) &&
         (*(char *)((long)&from_msg[3]._internal_metadata_.ptr_ + 4) == '\x01')) {
        *(undefined1 *)((long)&to_msg[3]._internal_metadata_.ptr_ + 4) = 1;
      }
      if (((uVar1 >> 0x1d & 1) != 0) &&
         (*(char *)((long)&from_msg[3]._internal_metadata_.ptr_ + 5) == '\x01')) {
        *(undefined1 *)((long)&to_msg[3]._internal_metadata_.ptr_ + 5) = 1;
      }
      if (((uVar1 >> 0x1e & 1) != 0) &&
         (*(char *)((long)&from_msg[3]._internal_metadata_.ptr_ + 6) == '\x01')) {
        *(undefined1 *)((long)&to_msg[3]._internal_metadata_.ptr_ + 6) = 1;
      }
      if ((int)uVar1 < 0) {
        from_msg_00 = (MessageLite *)from_msg[4]._vptr_MessageLite;
        if (from_msg_00 == (MessageLite *)0x0) {
          MergeImpl((TestHasbits *)&stack0xffffffffffffffd8);
          goto LAB_00d1f5fd;
        }
        if ((MessageLite *)to_msg[4]._vptr_MessageLite == (MessageLite *)0x0) {
          pp_Var4 = (_func_int **)
                    google::protobuf::Arena::CopyConstruct<proto3_unittest::TestAllTypes>
                              (arena,from_msg_00);
          to_msg[4]._vptr_MessageLite = pp_Var4;
        }
        else {
          TestAllTypes::MergeImpl((MessageLite *)to_msg[4]._vptr_MessageLite,from_msg_00);
        }
      }
    }
    uVar1 = *(uint *)((long)&from_msg[1]._vptr_MessageLite + 4);
    if ((char)uVar1 != '\0') {
      if (((uVar1 & 1) != 0) && ((char)from_msg[4]._internal_metadata_.ptr_ == '\x01')) {
        *(undefined1 *)&to_msg[4]._internal_metadata_.ptr_ = 1;
      }
      if (((uVar1 & 2) != 0) &&
         (*(char *)((long)&from_msg[4]._internal_metadata_.ptr_ + 1) == '\x01')) {
        *(undefined1 *)((long)&to_msg[4]._internal_metadata_.ptr_ + 1) = 1;
      }
      if (((uVar1 & 4) != 0) &&
         (*(char *)((long)&from_msg[4]._internal_metadata_.ptr_ + 2) == '\x01')) {
        *(undefined1 *)((long)&to_msg[4]._internal_metadata_.ptr_ + 2) = 1;
      }
      if (((uVar1 & 8) != 0) &&
         (*(char *)((long)&from_msg[4]._internal_metadata_.ptr_ + 3) == '\x01')) {
        *(undefined1 *)((long)&to_msg[4]._internal_metadata_.ptr_ + 3) = 1;
      }
      if (((uVar1 & 0x10) != 0) &&
         (*(char *)((long)&from_msg[4]._internal_metadata_.ptr_ + 4) == '\x01')) {
        *(undefined1 *)((long)&to_msg[4]._internal_metadata_.ptr_ + 4) = 1;
      }
      if (((uVar1 & 0x20) != 0) &&
         (*(char *)((long)&from_msg[4]._internal_metadata_.ptr_ + 5) == '\x01')) {
        *(undefined1 *)((long)&to_msg[4]._internal_metadata_.ptr_ + 5) = 1;
      }
      if (((uVar1 & 0x40) != 0) &&
         (*(char *)((long)&from_msg[4]._internal_metadata_.ptr_ + 6) == '\x01')) {
        *(undefined1 *)((long)&to_msg[4]._internal_metadata_.ptr_ + 6) = 1;
      }
      if (((char)uVar1 < '\0') &&
         (*(char *)((long)&from_msg[4]._internal_metadata_.ptr_ + 7) == '\x01')) {
        *(undefined1 *)((long)&to_msg[4]._internal_metadata_.ptr_ + 7) = 1;
      }
    }
    if ((uVar1 & 0xff00) != 0) {
      if (((uVar1 >> 8 & 1) != 0) && (*(char *)&from_msg[5]._vptr_MessageLite == '\x01')) {
        *(undefined1 *)&to_msg[5]._vptr_MessageLite = 1;
      }
      if (((uVar1 >> 9 & 1) != 0) && (*(char *)((long)&from_msg[5]._vptr_MessageLite + 1) == '\x01')
         ) {
        *(undefined1 *)((long)&to_msg[5]._vptr_MessageLite + 1) = 1;
      }
      if (((uVar1 >> 10 & 1) != 0) &&
         (*(char *)((long)&from_msg[5]._vptr_MessageLite + 2) == '\x01')) {
        *(undefined1 *)((long)&to_msg[5]._vptr_MessageLite + 2) = 1;
      }
      if (((uVar1 >> 0xb & 1) != 0) &&
         (*(char *)((long)&from_msg[5]._vptr_MessageLite + 3) == '\x01')) {
        *(undefined1 *)((long)&to_msg[5]._vptr_MessageLite + 3) = 1;
      }
      if (((uVar1 >> 0xc & 1) != 0) &&
         (*(char *)((long)&from_msg[5]._vptr_MessageLite + 4) == '\x01')) {
        *(undefined1 *)((long)&to_msg[5]._vptr_MessageLite + 4) = 1;
      }
      if (((uVar1 >> 0xd & 1) != 0) &&
         (*(char *)((long)&from_msg[5]._vptr_MessageLite + 5) == '\x01')) {
        *(undefined1 *)((long)&to_msg[5]._vptr_MessageLite + 5) = 1;
      }
      if (((uVar1 >> 0xe & 1) != 0) &&
         (*(char *)((long)&from_msg[5]._vptr_MessageLite + 6) == '\x01')) {
        *(undefined1 *)((long)&to_msg[5]._vptr_MessageLite + 6) = 1;
      }
      if (((short)uVar1 < 0) && (*(char *)((long)&from_msg[5]._vptr_MessageLite + 7) == '\x01')) {
        *(undefined1 *)((long)&to_msg[5]._vptr_MessageLite + 7) = 1;
      }
    }
    if ((uVar1 & 0xff0000) != 0) {
      if (((uVar1 >> 0x10 & 1) != 0) && ((char)from_msg[5]._internal_metadata_.ptr_ == '\x01')) {
        *(undefined1 *)&to_msg[5]._internal_metadata_.ptr_ = 1;
      }
      if (((uVar1 >> 0x11 & 1) != 0) &&
         (*(char *)((long)&from_msg[5]._internal_metadata_.ptr_ + 1) == '\x01')) {
        *(undefined1 *)((long)&to_msg[5]._internal_metadata_.ptr_ + 1) = 1;
      }
      if (((uVar1 >> 0x12 & 1) != 0) &&
         (*(char *)((long)&from_msg[5]._internal_metadata_.ptr_ + 2) == '\x01')) {
        *(undefined1 *)((long)&to_msg[5]._internal_metadata_.ptr_ + 2) = 1;
      }
      if (((uVar1 >> 0x13 & 1) != 0) &&
         (*(char *)((long)&from_msg[5]._internal_metadata_.ptr_ + 3) == '\x01')) {
        *(undefined1 *)((long)&to_msg[5]._internal_metadata_.ptr_ + 3) = 1;
      }
      if (((uVar1 >> 0x14 & 1) != 0) &&
         (*(char *)((long)&from_msg[5]._internal_metadata_.ptr_ + 4) == '\x01')) {
        *(undefined1 *)((long)&to_msg[5]._internal_metadata_.ptr_ + 4) = 1;
      }
      if (((uVar1 >> 0x15 & 1) != 0) &&
         (*(char *)((long)&from_msg[5]._internal_metadata_.ptr_ + 5) == '\x01')) {
        *(undefined1 *)((long)&to_msg[5]._internal_metadata_.ptr_ + 5) = 1;
      }
      if (((uVar1 >> 0x16 & 1) != 0) &&
         (*(char *)((long)&from_msg[5]._internal_metadata_.ptr_ + 6) == '\x01')) {
        *(undefined1 *)((long)&to_msg[5]._internal_metadata_.ptr_ + 6) = 1;
      }
      if (((uVar1 >> 0x17 & 1) != 0) &&
         (*(char *)((long)&from_msg[5]._internal_metadata_.ptr_ + 7) == '\x01')) {
        *(undefined1 *)((long)&to_msg[5]._internal_metadata_.ptr_ + 7) = 1;
      }
    }
    if (0xffffff < uVar1) {
      if (((uVar1 >> 0x18 & 1) != 0) && (*(char *)&from_msg[6]._vptr_MessageLite == '\x01')) {
        *(undefined1 *)&to_msg[6]._vptr_MessageLite = 1;
      }
      if (((uVar1 >> 0x19 & 1) != 0) &&
         (*(char *)((long)&from_msg[6]._vptr_MessageLite + 1) == '\x01')) {
        *(undefined1 *)((long)&to_msg[6]._vptr_MessageLite + 1) = 1;
      }
      if (((uVar1 >> 0x1a & 1) != 0) &&
         (*(char *)((long)&from_msg[6]._vptr_MessageLite + 2) == '\x01')) {
        *(undefined1 *)((long)&to_msg[6]._vptr_MessageLite + 2) = 1;
      }
      if (((uVar1 >> 0x1b & 1) != 0) &&
         (*(char *)((long)&from_msg[6]._vptr_MessageLite + 3) == '\x01')) {
        *(undefined1 *)((long)&to_msg[6]._vptr_MessageLite + 3) = 1;
      }
      if (((uVar1 >> 0x1c & 1) != 0) &&
         (*(char *)((long)&from_msg[6]._vptr_MessageLite + 4) == '\x01')) {
        *(undefined1 *)((long)&to_msg[6]._vptr_MessageLite + 4) = 1;
      }
      if (((uVar1 >> 0x1d & 1) != 0) &&
         (*(char *)((long)&from_msg[6]._vptr_MessageLite + 5) == '\x01')) {
        *(undefined1 *)((long)&to_msg[6]._vptr_MessageLite + 5) = 1;
      }
      if (((uVar1 >> 0x1e & 1) != 0) &&
         (*(char *)((long)&from_msg[6]._vptr_MessageLite + 6) == '\x01')) {
        *(undefined1 *)((long)&to_msg[6]._vptr_MessageLite + 6) = 1;
      }
      if (((int)uVar1 < 0) && (*(char *)((long)&from_msg[6]._vptr_MessageLite + 7) == '\x01')) {
        *(undefined1 *)((long)&to_msg[6]._vptr_MessageLite + 7) = 1;
      }
    }
    iVar3 = from_msg[1]._internal_metadata_.ptr_;
    if ((iVar3 & 0x3f) != 0) {
      if (((iVar3 & 1) != 0) && ((char)from_msg[6]._internal_metadata_.ptr_ == '\x01')) {
        *(undefined1 *)&to_msg[6]._internal_metadata_.ptr_ = 1;
      }
      if (((iVar3 & 2) != 0) &&
         (*(char *)((long)&from_msg[6]._internal_metadata_.ptr_ + 1) == '\x01')) {
        *(undefined1 *)((long)&to_msg[6]._internal_metadata_.ptr_ + 1) = 1;
      }
      if (((iVar3 & 4) != 0) &&
         (*(char *)((long)&from_msg[6]._internal_metadata_.ptr_ + 2) == '\x01')) {
        *(undefined1 *)((long)&to_msg[6]._internal_metadata_.ptr_ + 2) = 1;
      }
      if (((iVar3 & 8) != 0) &&
         (*(char *)((long)&from_msg[6]._internal_metadata_.ptr_ + 3) == '\x01')) {
        *(undefined1 *)((long)&to_msg[6]._internal_metadata_.ptr_ + 3) = 1;
      }
      if (((iVar3 & 0x10) != 0) &&
         (*(char *)((long)&from_msg[6]._internal_metadata_.ptr_ + 4) == '\x01')) {
        *(undefined1 *)((long)&to_msg[6]._internal_metadata_.ptr_ + 4) = 1;
      }
      if (((iVar3 & 0x20) != 0) &&
         (*(char *)((long)&from_msg[6]._internal_metadata_.ptr_ + 5) == '\x01')) {
        *(undefined1 *)((long)&to_msg[6]._internal_metadata_.ptr_ + 5) = 1;
      }
    }
    to_msg[1]._vptr_MessageLite =
         (_func_int **)((ulong)to_msg[1]._vptr_MessageLite | (ulong)from_msg[1]._vptr_MessageLite);
    *(uint *)&to_msg[1]._internal_metadata_.ptr_ =
         (uint)to_msg[1]._internal_metadata_.ptr_ | (uint)from_msg[1]._internal_metadata_.ptr_;
    uVar2 = (from_msg->_internal_metadata_).ptr_;
    if ((uVar2 & 1) == 0) {
      return;
    }
    google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8));
    return;
  }
LAB_00d1f5fd:
  MergeImpl();
}

Assistant:

void TestHasbits::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestHasbits*>(&to_msg);
  auto& from = static_cast<const TestHasbits&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto3_unittest.TestHasbits)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (from._internal_b1() != 0) {
        _this->_impl_.b1_ = from._impl_.b1_;
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (from._internal_b2() != 0) {
        _this->_impl_.b2_ = from._impl_.b2_;
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (from._internal_b3() != 0) {
        _this->_impl_.b3_ = from._impl_.b3_;
      }
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (from._internal_b4() != 0) {
        _this->_impl_.b4_ = from._impl_.b4_;
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      if (from._internal_b5() != 0) {
        _this->_impl_.b5_ = from._impl_.b5_;
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      if (from._internal_b6() != 0) {
        _this->_impl_.b6_ = from._impl_.b6_;
      }
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      if (from._internal_b7() != 0) {
        _this->_impl_.b7_ = from._impl_.b7_;
      }
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      if (from._internal_b8() != 0) {
        _this->_impl_.b8_ = from._impl_.b8_;
      }
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      if (from._internal_b9() != 0) {
        _this->_impl_.b9_ = from._impl_.b9_;
      }
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      if (from._internal_b10() != 0) {
        _this->_impl_.b10_ = from._impl_.b10_;
      }
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      if (from._internal_b11() != 0) {
        _this->_impl_.b11_ = from._impl_.b11_;
      }
    }
    if ((cached_has_bits & 0x00000800u) != 0) {
      if (from._internal_b12() != 0) {
        _this->_impl_.b12_ = from._impl_.b12_;
      }
    }
    if ((cached_has_bits & 0x00001000u) != 0) {
      if (from._internal_b13() != 0) {
        _this->_impl_.b13_ = from._impl_.b13_;
      }
    }
    if ((cached_has_bits & 0x00002000u) != 0) {
      if (from._internal_b14() != 0) {
        _this->_impl_.b14_ = from._impl_.b14_;
      }
    }
    if ((cached_has_bits & 0x00004000u) != 0) {
      if (from._internal_b15() != 0) {
        _this->_impl_.b15_ = from._impl_.b15_;
      }
    }
    if ((cached_has_bits & 0x00008000u) != 0) {
      if (from._internal_b16() != 0) {
        _this->_impl_.b16_ = from._impl_.b16_;
      }
    }
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    if ((cached_has_bits & 0x00010000u) != 0) {
      if (from._internal_b17() != 0) {
        _this->_impl_.b17_ = from._impl_.b17_;
      }
    }
    if ((cached_has_bits & 0x00020000u) != 0) {
      if (from._internal_b18() != 0) {
        _this->_impl_.b18_ = from._impl_.b18_;
      }
    }
    if ((cached_has_bits & 0x00040000u) != 0) {
      if (from._internal_b19() != 0) {
        _this->_impl_.b19_ = from._impl_.b19_;
      }
    }
    if ((cached_has_bits & 0x00080000u) != 0) {
      if (from._internal_b20() != 0) {
        _this->_impl_.b20_ = from._impl_.b20_;
      }
    }
    if ((cached_has_bits & 0x00100000u) != 0) {
      if (from._internal_b21() != 0) {
        _this->_impl_.b21_ = from._impl_.b21_;
      }
    }
    if ((cached_has_bits & 0x00200000u) != 0) {
      if (from._internal_b22() != 0) {
        _this->_impl_.b22_ = from._impl_.b22_;
      }
    }
    if ((cached_has_bits & 0x00400000u) != 0) {
      if (from._internal_b23() != 0) {
        _this->_impl_.b23_ = from._impl_.b23_;
      }
    }
    if ((cached_has_bits & 0x00800000u) != 0) {
      if (from._internal_b24() != 0) {
        _this->_impl_.b24_ = from._impl_.b24_;
      }
    }
  }
  if ((cached_has_bits & 0xff000000u) != 0) {
    if ((cached_has_bits & 0x01000000u) != 0) {
      if (from._internal_b25() != 0) {
        _this->_impl_.b25_ = from._impl_.b25_;
      }
    }
    if ((cached_has_bits & 0x02000000u) != 0) {
      if (from._internal_b26() != 0) {
        _this->_impl_.b26_ = from._impl_.b26_;
      }
    }
    if ((cached_has_bits & 0x04000000u) != 0) {
      if (from._internal_b27() != 0) {
        _this->_impl_.b27_ = from._impl_.b27_;
      }
    }
    if ((cached_has_bits & 0x08000000u) != 0) {
      if (from._internal_b28() != 0) {
        _this->_impl_.b28_ = from._impl_.b28_;
      }
    }
    if ((cached_has_bits & 0x10000000u) != 0) {
      if (from._internal_b29() != 0) {
        _this->_impl_.b29_ = from._impl_.b29_;
      }
    }
    if ((cached_has_bits & 0x20000000u) != 0) {
      if (from._internal_b30() != 0) {
        _this->_impl_.b30_ = from._impl_.b30_;
      }
    }
    if ((cached_has_bits & 0x40000000u) != 0) {
      if (from._internal_b31() != 0) {
        _this->_impl_.b31_ = from._impl_.b31_;
      }
    }
    if ((cached_has_bits & 0x80000000u) != 0) {
      ABSL_DCHECK(from._impl_.child_ != nullptr);
      if (_this->_impl_.child_ == nullptr) {
        _this->_impl_.child_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.child_);
      } else {
        _this->_impl_.child_->MergeFrom(*from._impl_.child_);
      }
    }
  }
  cached_has_bits = from._impl_._has_bits_[1];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (from._internal_b32() != 0) {
        _this->_impl_.b32_ = from._impl_.b32_;
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (from._internal_b33() != 0) {
        _this->_impl_.b33_ = from._impl_.b33_;
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (from._internal_b34() != 0) {
        _this->_impl_.b34_ = from._impl_.b34_;
      }
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (from._internal_b35() != 0) {
        _this->_impl_.b35_ = from._impl_.b35_;
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      if (from._internal_b36() != 0) {
        _this->_impl_.b36_ = from._impl_.b36_;
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      if (from._internal_b37() != 0) {
        _this->_impl_.b37_ = from._impl_.b37_;
      }
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      if (from._internal_b38() != 0) {
        _this->_impl_.b38_ = from._impl_.b38_;
      }
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      if (from._internal_b39() != 0) {
        _this->_impl_.b39_ = from._impl_.b39_;
      }
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      if (from._internal_b40() != 0) {
        _this->_impl_.b40_ = from._impl_.b40_;
      }
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      if (from._internal_b41() != 0) {
        _this->_impl_.b41_ = from._impl_.b41_;
      }
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      if (from._internal_b42() != 0) {
        _this->_impl_.b42_ = from._impl_.b42_;
      }
    }
    if ((cached_has_bits & 0x00000800u) != 0) {
      if (from._internal_b43() != 0) {
        _this->_impl_.b43_ = from._impl_.b43_;
      }
    }
    if ((cached_has_bits & 0x00001000u) != 0) {
      if (from._internal_b44() != 0) {
        _this->_impl_.b44_ = from._impl_.b44_;
      }
    }
    if ((cached_has_bits & 0x00002000u) != 0) {
      if (from._internal_b45() != 0) {
        _this->_impl_.b45_ = from._impl_.b45_;
      }
    }
    if ((cached_has_bits & 0x00004000u) != 0) {
      if (from._internal_b46() != 0) {
        _this->_impl_.b46_ = from._impl_.b46_;
      }
    }
    if ((cached_has_bits & 0x00008000u) != 0) {
      if (from._internal_b47() != 0) {
        _this->_impl_.b47_ = from._impl_.b47_;
      }
    }
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    if ((cached_has_bits & 0x00010000u) != 0) {
      if (from._internal_b48() != 0) {
        _this->_impl_.b48_ = from._impl_.b48_;
      }
    }
    if ((cached_has_bits & 0x00020000u) != 0) {
      if (from._internal_b49() != 0) {
        _this->_impl_.b49_ = from._impl_.b49_;
      }
    }
    if ((cached_has_bits & 0x00040000u) != 0) {
      if (from._internal_b50() != 0) {
        _this->_impl_.b50_ = from._impl_.b50_;
      }
    }
    if ((cached_has_bits & 0x00080000u) != 0) {
      if (from._internal_b51() != 0) {
        _this->_impl_.b51_ = from._impl_.b51_;
      }
    }
    if ((cached_has_bits & 0x00100000u) != 0) {
      if (from._internal_b52() != 0) {
        _this->_impl_.b52_ = from._impl_.b52_;
      }
    }
    if ((cached_has_bits & 0x00200000u) != 0) {
      if (from._internal_b53() != 0) {
        _this->_impl_.b53_ = from._impl_.b53_;
      }
    }
    if ((cached_has_bits & 0x00400000u) != 0) {
      if (from._internal_b54() != 0) {
        _this->_impl_.b54_ = from._impl_.b54_;
      }
    }
    if ((cached_has_bits & 0x00800000u) != 0) {
      if (from._internal_b55() != 0) {
        _this->_impl_.b55_ = from._impl_.b55_;
      }
    }
  }
  if ((cached_has_bits & 0xff000000u) != 0) {
    if ((cached_has_bits & 0x01000000u) != 0) {
      if (from._internal_b56() != 0) {
        _this->_impl_.b56_ = from._impl_.b56_;
      }
    }
    if ((cached_has_bits & 0x02000000u) != 0) {
      if (from._internal_b57() != 0) {
        _this->_impl_.b57_ = from._impl_.b57_;
      }
    }
    if ((cached_has_bits & 0x04000000u) != 0) {
      if (from._internal_b58() != 0) {
        _this->_impl_.b58_ = from._impl_.b58_;
      }
    }
    if ((cached_has_bits & 0x08000000u) != 0) {
      if (from._internal_b59() != 0) {
        _this->_impl_.b59_ = from._impl_.b59_;
      }
    }
    if ((cached_has_bits & 0x10000000u) != 0) {
      if (from._internal_b60() != 0) {
        _this->_impl_.b60_ = from._impl_.b60_;
      }
    }
    if ((cached_has_bits & 0x20000000u) != 0) {
      if (from._internal_b61() != 0) {
        _this->_impl_.b61_ = from._impl_.b61_;
      }
    }
    if ((cached_has_bits & 0x40000000u) != 0) {
      if (from._internal_b62() != 0) {
        _this->_impl_.b62_ = from._impl_.b62_;
      }
    }
    if ((cached_has_bits & 0x80000000u) != 0) {
      if (from._internal_b63() != 0) {
        _this->_impl_.b63_ = from._impl_.b63_;
      }
    }
  }
  cached_has_bits = from._impl_._has_bits_[2];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (from._internal_b64() != 0) {
        _this->_impl_.b64_ = from._impl_.b64_;
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (from._internal_b65() != 0) {
        _this->_impl_.b65_ = from._impl_.b65_;
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (from._internal_b66() != 0) {
        _this->_impl_.b66_ = from._impl_.b66_;
      }
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (from._internal_b67() != 0) {
        _this->_impl_.b67_ = from._impl_.b67_;
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      if (from._internal_b68() != 0) {
        _this->_impl_.b68_ = from._impl_.b68_;
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      if (from._internal_b69() != 0) {
        _this->_impl_.b69_ = from._impl_.b69_;
      }
    }
  }
  _this->_impl_._has_bits_.Or(from._impl_._has_bits_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}